

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateExtension
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  int iVar1;
  int iVar2;
  Printer *this_00;
  bool bVar3;
  char *pcVar4;
  long *plVar5;
  FieldDescriptor *field_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  GeneratorOptions *extraout_RDX;
  GeneratorOptions *extraout_RDX_00;
  GeneratorOptions *options_00;
  GeneratorOptions *options_01;
  GeneratorOptions *options_02;
  Descriptor *pDVar7;
  char (*args_9) [2];
  undefined1 in_stack_fffffffffffffe18;
  string local_1d0;
  undefined1 local_1b0 [32];
  Printer *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string extension_object_name;
  undefined1 local_d8 [32];
  string extension_scope;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  FieldDescriptor *local_38;
  
  pDVar7 = *(Descriptor **)(field + 0x60);
  if (pDVar7 == (Descriptor *)0x0) {
    pDVar7 = *(Descriptor **)(field + 0x28);
    (anonymous_namespace)::GetNamespace_abi_cxx11_
              (&extension_scope,
               (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
               (FileDescriptor *)pDVar7);
    options_00 = extraout_RDX_00;
  }
  else {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&extension_scope,
               (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,pDVar7);
    options_00 = extraout_RDX;
  }
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&extension_object_name,(_anonymous_namespace_ *)field,options_00,
             (FieldDescriptor *)pDVar7);
  (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
            (&local_148,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
             (FieldDescriptor *)0x0,true,false,false,BYTES_DEFAULT,(bool)in_stack_fffffffffffffe18);
  io::Printer::
  Print<char[14],std::__cxx11::string,char[5],std::__cxx11::string,char[6],std::__cxx11::string,char[14],std::__cxx11::string>
            (printer,
             "\n/**\n * A tuple of {field number, class constructor} for the extension\n * field named `$nameInComment$`.\n * @type {!jspb.ExtensionFieldInfo<$extensionType$>}\n */\n$class$.$name$ = new jspb.ExtensionFieldInfo(\n"
             ,(char (*) [14])"nameInComment",&extension_object_name,(char (*) [5])0x3918cc,
             &extension_object_name,(char (*) [6])0x39ef2d,&extension_scope,
             (char (*) [14])"extensionType",&local_148);
  paVar6 = &local_148.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar6) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"name","name",field);
  local_148._M_dataplus._M_p = (pointer)paVar6;
  pcVar4 = FastInt32ToBufferLeft(*(int32 *)(field + 0x44),paVar6->_M_local_buf);
  local_148._M_string_length = (long)pcVar4 - (long)paVar6;
  field_00 = (FieldDescriptor *)(local_1b0 + 0x10);
  local_1b0._0_8_ = field_00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,local_148._M_dataplus._M_p,
             local_148._M_dataplus._M_p + local_148._M_string_length);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_188._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_d8._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_188,
               (FieldDescriptor **)local_d8);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_1d0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,field_00);
  }
  else {
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"null","");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_d8._0_8_ = FieldDescriptor::TypeOnceInit;
    local_58._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_d8,
               (FieldDescriptor **)local_58);
  }
  iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
  local_190 = printer;
  if (iVar1 == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              ((string *)local_d8,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               field_00);
    plVar5 = (long *)std::__cxx11::string::append(local_d8);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar6) {
      local_188.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_188.field_2._8_8_ = plVar5[3];
    }
    else {
      local_188.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_188._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_188._M_string_length = plVar5[1];
    *plVar5 = (long)paVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  else {
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"null","");
  }
  args_9 = (char (*) [2])0x397e32;
  if (*(int *)(field + 0x3c) == 3) {
    args_9 = (char (*) [2])0x398df4;
  }
  pDVar7 = (Descriptor *)0x3918cc;
  io::Printer::
  Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[5],std::__cxx11::string,char[9],std::__cxx11::string,char[9],char[2]>
            (local_190,
             "    $index$,\n    {$name$: 0},\n    $ctor$,\n     /** @type {?function((boolean|undefined),!jspb.Message=): !Object} */ (\n         $toObject$),\n    $repeated$);\n"
             ,(char (*) [6])0x3a4ffa,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (char (*) [5])0x3918cc,&extension_object_name,(char (*) [5])0x39d873,&local_1d0,
             (char (*) [9])0x3985c1,&local_188,(char (*) [9])"repeated",args_9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  paVar6 = &local_148.field_2;
  if ((iVar1 == 10) && ((FieldDescriptor *)local_d8._0_8_ != (FieldDescriptor *)(local_d8 + 0x10)))
  {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_1b0._0_8_ != (FieldDescriptor *)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_);
  }
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            ((string *)local_1b0,(_anonymous_namespace_ *)options,
             *(GeneratorOptions **)(field + 0x28),*(FileDescriptor **)(field + 0x50),pDVar7);
  local_148._M_dataplus._M_p = (pointer)paVar6;
  pcVar4 = FastInt32ToBufferLeft(*(int32 *)(field + 0x44),paVar6->_M_local_buf);
  local_148._M_string_length = (long)pcVar4 - (long)paVar6;
  paVar6 = &local_1d0.field_2;
  local_1d0._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,local_148._M_dataplus._M_p,
             local_148._M_dataplus._M_p + local_148._M_string_length);
  (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
            (&local_188,(_anonymous_namespace_ *)field,options_01,
             (FieldDescriptor *)paVar6->_M_local_buf);
  (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
            ((string *)local_58,(_anonymous_namespace_ *)field,options_02,
             (FieldDescriptor *)paVar6->_M_local_buf);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_78._0_8_ = FieldDescriptor::TypeOnceInit;
    local_168._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_78,
               (FieldDescriptor **)&local_168);
  }
  iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
  if (iVar1 == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              ((string *)local_78,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)paVar6->_M_local_buf);
    plVar5 = (long *)std::__cxx11::string::append(local_78);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar6) {
      local_118.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_118.field_2._8_8_ = plVar5[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_118._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_118._M_string_length = plVar5[1];
    *plVar5 = (long)paVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  else {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"undefined","");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_98._0_8_ = FieldDescriptor::TypeOnceInit;
    local_38 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_98,&local_38);
  }
  iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
  if (iVar2 == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              ((string *)local_98,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)paVar6->_M_local_buf);
    plVar5 = (long *)std::__cxx11::string::append(local_98);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar6) {
      local_168.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_168.field_2._8_8_ = plVar5[3];
    }
    else {
      local_168.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_168._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_168._M_string_length = plVar5[1];
    *plVar5 = (long)paVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  else {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"undefined","");
  }
  pDVar7 = (Descriptor *)0x3a4ffa;
  io::Printer::
  Print<char[11],std::__cxx11::string,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[15],std::__cxx11::string,char[15],std::__cxx11::string,char[25],std::__cxx11::string,char[27],std::__cxx11::string>
            (local_190,
             "\n$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n    $class$.$name$,\n    $binaryReaderFn$,\n    $binaryWriterFn$,\n    $binaryMessageSerializeFn$,\n    $binaryMessageDeserializeFn$,\n"
             ,(char (*) [11])"extendName",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (char (*) [6])0x3a4ffa,&local_1d0,(char (*) [6])0x39ef2d,&extension_scope,
             (char (*) [5])0x3918cc,&extension_object_name,(char (*) [15])"binaryReaderFn",
             &local_188,(char (*) [15])"binaryWriterFn",(string *)local_58,
             (char (*) [25])"binaryMessageSerializeFn",&local_118,
             (char (*) [27])"binaryMessageDeserializeFn",&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  this_00 = local_190;
  paVar6 = &local_148.field_2;
  if ((iVar2 == 10) && ((undefined1 *)local_98._0_8_ != local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((iVar1 == 10) && ((undefined1 *)local_78._0_8_ != local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((FieldDescriptor *)local_58._0_8_ != (FieldDescriptor *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_1b0._0_8_ != (FieldDescriptor *)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_);
  }
  bVar3 = FieldDescriptor::is_packed(field);
  local_148._M_dataplus._M_p = "false";
  if (bVar3) {
    local_148._M_dataplus._M_p = "true";
  }
  io::Printer::Print<char[9],char_const*>
            (this_00,"    $isPacked$);\n",(char (*) [9])"isPacked",(char **)&local_148);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            ((string *)local_1b0,(_anonymous_namespace_ *)options,
             *(GeneratorOptions **)(field + 0x28),*(FileDescriptor **)(field + 0x50),pDVar7);
  local_148._M_dataplus._M_p = (pointer)paVar6;
  pcVar4 = FastInt32ToBufferLeft(*(int32 *)(field + 0x44),paVar6->_M_local_buf);
  local_148._M_string_length = (long)pcVar4 - (long)paVar6;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,local_148._M_dataplus._M_p,
             local_148._M_dataplus._M_p + local_148._M_string_length);
  io::Printer::
  Print<char[11],std::__cxx11::string,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[5],std::__cxx11::string>
            (this_00,
             "// This registers the extension field with the extended class, so that\n// toObject() will function correctly.\n$extendName$[$index$] = $class$.$name$;\n\n"
             ,(char (*) [11])"extendName",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (char (*) [6])0x3a4ffa,&local_1d0,(char (*) [6])0x39ef2d,&extension_scope,
             (char (*) [5])0x3918cc,&extension_object_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_1b0._0_8_ != (FieldDescriptor *)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)extension_object_name._M_dataplus._M_p != &extension_object_name.field_2) {
    operator_delete(extension_object_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)extension_scope._M_dataplus._M_p != &extension_scope.field_2) {
    operator_delete(extension_scope._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::GenerateExtension(const GeneratorOptions& options,
                                  io::Printer* printer,
                                  const FieldDescriptor* field) const {
  std::string extension_scope =
      (field->extension_scope()
           ? GetMessagePath(options, field->extension_scope())
           : GetNamespace(options, field->file()));

  const std::string extension_object_name = JSObjectFieldName(options, field);
  printer->Print(
      "\n"
      "/**\n"
      " * A tuple of {field number, class constructor} for the extension\n"
      " * field named `$nameInComment$`.\n"
      " * @type {!jspb.ExtensionFieldInfo<$extensionType$>}\n"
      " */\n"
      "$class$.$name$ = new jspb.ExtensionFieldInfo(\n",
      "nameInComment", extension_object_name, "name", extension_object_name,
      "class", extension_scope, "extensionType",
      JSFieldTypeAnnotation(options, field,
                            /* is_setter_argument = */ false,
                            /* force_present = */ true,
                            /* singular_if_not_packed = */ false));
  printer->Annotate("name", field);
  printer->Print(
      "    $index$,\n"
      "    {$name$: 0},\n"
      "    $ctor$,\n"
      "     /** @type {?function((boolean|undefined),!jspb.Message=): "
      "!Object} */ (\n"
      "         $toObject$),\n"
      "    $repeated$);\n",
      "index", StrCat(field->number()), "name", extension_object_name,
      "ctor",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
           ? SubmessageTypeRef(options, field)
           : std::string("null")),
      "toObject",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE
           ? (SubmessageTypeRef(options, field) + ".toObject")
           : std::string("null")),
      "repeated", (field->is_repeated() ? "1" : "0"));

  printer->Print(
      "\n"
      "$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n"
      "    $class$.$name$,\n"
      "    $binaryReaderFn$,\n"
      "    $binaryWriterFn$,\n"
      "    $binaryMessageSerializeFn$,\n"
      "    $binaryMessageDeserializeFn$,\n",
      "extendName",
      JSExtensionsObjectName(options, field->file(), field->containing_type()),
      "index", StrCat(field->number()), "class", extension_scope, "name",
      extension_object_name, "binaryReaderFn",
      JSBinaryReaderMethodName(options, field), "binaryWriterFn",
      JSBinaryWriterMethodName(options, field), "binaryMessageSerializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".serializeBinaryToWriter")
          : "undefined",
      "binaryMessageDeserializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".deserializeBinaryFromReader")
          : "undefined");

  printer->Print("    $isPacked$);\n", "isPacked",
                 (field->is_packed() ? "true" : "false"));

  printer->Print(
      "// This registers the extension field with the extended class, so that\n"
      "// toObject() will function correctly.\n"
      "$extendName$[$index$] = $class$.$name$;\n"
      "\n",
      "extendName",
      JSExtensionsObjectName(options, field->file(), field->containing_type()),
      "index", StrCat(field->number()), "class", extension_scope, "name",
      extension_object_name);
}